

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O1

bool anon_unknown.dwarf_1c2549::checkSampleCount
               (Array2D<unsigned_int> *sampleCount,int x1,int x2,int y1,int y2,int width)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint *puVar4;
  ostream *poVar5;
  long *plVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  bool local_8b;
  
  local_8b = y2 < y1;
  if (y1 <= y2) {
    lVar3 = (long)x1;
    lVar10 = (long)y1 * 4;
    iVar11 = x1 + y1 * width + 1;
    lVar9 = (long)y1;
    do {
      if (x1 <= x2) {
        uVar12 = ((int)lVar9 * width + x1) % 10 + 1;
        iVar8 = x1;
        bVar2 = x2 < x1;
        if (sampleCount->_data[sampleCount->_sizeY * lVar9 + lVar3] == uVar12) {
          lVar7 = 0;
          puVar4 = (uint *)((long)sampleCount->_data + sampleCount->_sizeY * lVar10 + lVar3 * 4 + 4)
          ;
          iVar8 = iVar11;
          do {
            if (x1 - x2 == (int)lVar7) goto LAB_0017097f;
            uVar12 = iVar8 % 10 + 1;
            lVar7 = lVar7 + -1;
            iVar8 = iVar8 + 1;
            uVar1 = *puVar4;
            puVar4 = puVar4 + 1;
          } while (uVar1 == uVar12);
          bVar2 = (long)x2 <= (lVar3 + -1) - lVar7;
          iVar8 = x1 - (int)lVar7;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"sample count at ",0x10);
        poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)lVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
        poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", should be ",0xc);
        plVar6 = (long *)std::ostream::operator<<(poVar5,uVar12);
        std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
        std::ostream::put((char)plVar6);
        std::ostream::flush();
        std::ostream::flush();
        if (!bVar2) {
          return local_8b;
        }
      }
LAB_0017097f:
      lVar7 = lVar9 + 1;
      local_8b = y2 <= lVar9;
      lVar10 = lVar10 + 4;
      iVar11 = iVar11 + width;
      lVar9 = lVar7;
    } while (y2 + 1 != (int)lVar7);
  }
  return local_8b;
}

Assistant:

bool
checkSampleCount (Array2D<unsigned int>& sampleCount,
                  int x1, int x2, int y1, int y2, int width)
{
    for (int i = y1; i <= y2; i++)
    {
        for (int j = x1; j <= x2; j++)
        {
            if (sampleCount[i][j] != static_cast<unsigned int>(((i * width) + j) % 10 + 1))
            {
                cout << "sample count at " << j << ", " << i << ": " << sampleCount[i][j]
                     << ", should be " << (i * width + j) % 10 + 1 << endl << flush;
                return false;
            }
        }
    }
    return true;
}